

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::CallMetaMethod
          (SQVM *this,SQObjectPtr *closure,SQMetaMethod mm,SQInteger nparams,SQObjectPtr *outres)

{
  bool bVar1;
  
  this->_nmetamethodscall = this->_nmetamethodscall + 1;
  bVar1 = Call(this,closure,nparams,this->_top - nparams,outres,0);
  this->_nmetamethodscall = this->_nmetamethodscall + -1;
  Pop(this,nparams);
  return bVar1;
}

Assistant:

bool SQVM::CallMetaMethod(SQObjectPtr &closure,SQMetaMethod SQ_UNUSED_ARG(mm),SQInteger nparams,SQObjectPtr &outres)
{
    //SQObjectPtr closure;

    _nmetamethodscall++;
    if(Call(closure, nparams, _top - nparams, outres, SQFalse)) {
        _nmetamethodscall--;
        Pop(nparams);
        return true;
    }
    _nmetamethodscall--;
    //}
    Pop(nparams);
    return false;
}